

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::setTotalMass(btSoftBody *this,btScalar mass,bool fromfaces)

{
  int iVar1;
  int iVar2;
  Node *pNVar3;
  Face *x2;
  undefined1 in_SIL;
  long in_RDI;
  float in_XMM0_Da;
  btScalar bVar4;
  float fVar5;
  btScalar itm;
  btScalar tm;
  int j;
  btScalar twicearea;
  Face *f;
  int i;
  int in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int local_28;
  undefined4 in_stack_ffffffffffffffe8;
  int iVar6;
  undefined3 in_stack_fffffffffffffff0;
  uint uVar7;
  
  uVar7 = CONCAT13(in_SIL,in_stack_fffffffffffffff0) & 0x1ffffff;
  if ((char)(uVar7 >> 0x18) != '\0') {
    in_stack_ffffffffffffffc4 = 0;
    while (iVar6 = in_stack_ffffffffffffffc4,
          iVar1 = btAlignedObjectArray<btSoftBody::Node>::size
                            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370)),
          in_stack_ffffffffffffffc4 < iVar1) {
      pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),iVar6);
      pNVar3->m_im = 0.0;
      in_stack_ffffffffffffffc4 = iVar6 + 1;
    }
    in_stack_ffffffffffffffc0 = 0;
    while (iVar6 = in_stack_ffffffffffffffc0,
          iVar1 = btAlignedObjectArray<btSoftBody::Face>::size
                            ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0)),
          in_stack_ffffffffffffffc0 < iVar1) {
      x2 = btAlignedObjectArray<btSoftBody::Face>::operator[]
                     ((btAlignedObjectArray<btSoftBody::Face> *)(in_RDI + 0x3b0),iVar6);
      bVar4 = AreaOf((btVector3 *)CONCAT44(in_XMM0_Da,uVar7),
                     (btVector3 *)CONCAT44(iVar6,in_stack_ffffffffffffffe8),(btVector3 *)x2);
      for (local_28 = 0; local_28 < 3; local_28 = local_28 + 1) {
        x2->m_n[local_28]->m_im = bVar4 + x2->m_n[local_28]->m_im;
      }
      in_stack_ffffffffffffffc0 = iVar6 + 1;
    }
    iVar6 = 0;
    while (iVar1 = iVar6,
          iVar2 = btAlignedObjectArray<btSoftBody::Node>::size
                            ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370)),
          iVar6 < iVar2) {
      pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),iVar1);
      fVar5 = pNVar3->m_im;
      pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                         ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),iVar1);
      pNVar3->m_im = 1.0 / fVar5;
      iVar6 = iVar1 + 1;
    }
  }
  bVar4 = getTotalMass((btSoftBody *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
  iVar6 = 0;
  while (iVar1 = iVar6,
        iVar2 = btAlignedObjectArray<btSoftBody::Node>::size
                          ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370)),
        iVar6 < iVar2) {
    fVar5 = (1.0 / bVar4) * in_XMM0_Da;
    pNVar3 = btAlignedObjectArray<btSoftBody::Node>::operator[]
                       ((btAlignedObjectArray<btSoftBody::Node> *)(in_RDI + 0x370),iVar1);
    pNVar3->m_im = pNVar3->m_im / fVar5;
    iVar6 = iVar1 + 1;
  }
  *(undefined1 *)(in_RDI + 0x4b4) = 1;
  return;
}

Assistant:

void			btSoftBody::setTotalMass(btScalar mass,bool fromfaces)
{
	int i;

	if(fromfaces)
	{

		for(i=0;i<m_nodes.size();++i)
		{
			m_nodes[i].m_im=0;
		}
		for(i=0;i<m_faces.size();++i)
		{
			const Face&		f=m_faces[i];
			const btScalar	twicearea=AreaOf(	f.m_n[0]->m_x,
				f.m_n[1]->m_x,
				f.m_n[2]->m_x);
			for(int j=0;j<3;++j)
			{
				f.m_n[j]->m_im+=twicearea;
			}
		}
		for( i=0;i<m_nodes.size();++i)
		{
			m_nodes[i].m_im=1/m_nodes[i].m_im;
		}
	}
	const btScalar	tm=getTotalMass();
	const btScalar	itm=1/tm;
	for( i=0;i<m_nodes.size();++i)
	{
		m_nodes[i].m_im/=itm*mass;
	}
	m_bUpdateRtCst=true;
}